

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,
          TPZCompElH1<pzshape::TPZShapeQuad> *copy)

{
  long in_RDX;
  TPZRegisterClassId *in_RDI;
  TPZManVector<long,_9> *in_stack_ffffffffffffffc8;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  void **vtt;
  TPZManVector<long,_9> *this_00;
  
  this_00 = (TPZManVector<long,_9> *)0x0;
  vtt = (void **)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZIntelGen<pzshape::TPZShapeQuad>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02513558);
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            ((TPZIntelGen<pzshape::TPZShapeQuad> *)this_00,vtt,in_stack_ffffffffffffffd0,
             (TPZIntelGen<pzshape::TPZShapeQuad> *)in_stack_ffffffffffffffc8);
  *(undefined ***)in_RDI = &PTR__TPZCompElH1_02513140;
  *(undefined ***)in_RDI = &PTR__TPZCompElH1_02513140;
  TPZManVector<long,_9>::TPZManVector(this_00,(int64_t)vtt,(long *)in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0xb8) = *(undefined4 *)(in_RDX + 0xb8);
  TPZManVector<long,_9>::operator=
            ((TPZManVector<long,_9> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh, const TPZCompElH1<TSHAPE> &copy) : TPZRegisterClassId(&TPZCompElH1::ClassId),
                                                                                       TPZIntelGen<TSHAPE>(mesh,copy), fh1fam(copy.fh1fam){
	this->fConnectIndexes = copy.fConnectIndexes;
}